

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::loop(EventLoop *this)

{
  char *pcVar1;
  pointer psVar2;
  Channel *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ChannelList *activeChannels;
  LogStream *pLVar3;
  char **ppcVar4;
  int v;
  pointer psVar5;
  int *in_FS_OFFSET;
  Logger local_1010;
  ChannelList *local_38;
  
  if (this->looping_ != true) {
    assertInLoopThread(this);
    this->looping_ = true;
    Logger::Logger(&local_1010,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x32);
    if (7 < ((int)&local_1010 + 0xfa8) - (int)local_1010.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_1010.impl_.stream_.buffer_.cur_,"Thread ",7);
      local_1010.impl_.stream_.buffer_.cur_ = local_1010.impl_.stream_.buffer_.cur_ + 7;
    }
    pLVar3 = LogStream::operator<<((LogStream *)&local_1010,this->threadId_);
    ppcVar4 = &(pLVar3->buffer_).cur_;
    pcVar1 = (pLVar3->buffer_).cur_;
    if (0xe < (int)ppcVar4 - (int)pcVar1) {
      builtin_strncpy(pcVar1," start looping",0xe);
      *ppcVar4 = *ppcVar4 + 0xe;
    }
    Logger::~Logger(&local_1010);
    this->quit_ = false;
    local_38 = &this->activeChannels_;
    do {
      activeChannels = local_38;
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::clear
                (local_38);
      ((this->timer_).super___shared_ptr<TimerHeap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->timeFlag_ =
           true;
      EPoller::epoll((this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     -1,activeChannels);
      psVar2 = (this->activeChannels_).
               super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar5 = (this->activeChannels_).
                    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1
          ) {
        this_00 = (psVar5->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_01 = (psVar5->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        if (this_00->loop_ == this) {
          Channel::handleEvent(this_00);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      doPendingFuntors(this);
    } while (this->quit_ == false);
    Logger::Logger(&local_1010,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x3f);
    if (0x14 < ((int)&local_1010 + 0xfa8) - (int)local_1010.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_1010.impl_.stream_.buffer_.cur_,"EventLoop in thread ",0x14);
      local_1010.impl_.stream_.buffer_.cur_ = local_1010.impl_.stream_.buffer_.cur_ + 0x14;
    }
    v = *in_FS_OFFSET;
    if (v == 0) {
      CurrentThread::cacheTid();
      v = *in_FS_OFFSET;
    }
    pLVar3 = LogStream::operator<<((LogStream *)&local_1010,v);
    ppcVar4 = &(pLVar3->buffer_).cur_;
    pcVar1 = (pLVar3->buffer_).cur_;
    if (0xd < (int)ppcVar4 - (int)pcVar1) {
      builtin_strncpy(pcVar1," stop looping",0xd);
      *ppcVar4 = *ppcVar4 + 0xd;
    }
    Logger::~Logger(&local_1010);
    this->looping_ = false;
    return;
  }
  __assert_fail("!looping_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                ,0x2f,"void EventLoop::loop()");
}

Assistant:

void EventLoop::loop() {
    assert(!looping_);
    assertInLoopThread();
    looping_ = true;
    LOG <<"Thread " << threadId_ << " start looping";
    quit_ = false;
    while (!quit_) {
        activeChannels_.clear();
        timer_->setTimeFlag();
        poller_->epoll(-1, &activeChannels_);
        for (auto channel: activeChannels_) {
            if (channel->ownerLoop() == this)
                channel->handleEvent();
        }
        doPendingFuntors();
    }

    LOG << "EventLoop in thread " << CurrentThread::tid() << " stop looping";
    looping_ = false;
}